

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr_titlecase_brkiter.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::UnicodeString::toTitle
          (UnicodeString *this,BreakIterator *iter,Locale *locale,uint32_t options)

{
  int32_t caseLocale;
  BreakIterator *iter_00;
  char *locale_00;
  UErrorCode local_3c;
  UErrorCode errorCode;
  LocalPointer<icu_63::BreakIterator> ownedIter;
  uint32_t options_local;
  Locale *locale_local;
  BreakIterator *iter_local;
  UnicodeString *this_local;
  
  ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr._4_4_ = options;
  LocalPointer<icu_63::BreakIterator>::LocalPointer
            ((LocalPointer<icu_63::BreakIterator> *)&stack0xffffffffffffffc8,(BreakIterator *)0x0);
  local_3c = U_ZERO_ERROR;
  iter_00 = ustrcase_getTitleBreakIterator_63
                      (locale,"",ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr._4_4_,
                       iter,(LocalPointer<icu_63::BreakIterator> *)&stack0xffffffffffffffc8,
                       &local_3c);
  if (iter_00 == (BreakIterator *)0x0) {
    setToBogus(this);
  }
  else {
    locale_00 = Locale::getBaseName(locale);
    caseLocale = ustrcase_getCaseLocale_63(locale_00);
    caseMap(this,caseLocale,ownedIter.super_LocalPointerBase<icu_63::BreakIterator>.ptr._4_4_,
            iter_00,ustrcase_internalToTitle_63);
  }
  LocalPointer<icu_63::BreakIterator>::~LocalPointer
            ((LocalPointer<icu_63::BreakIterator> *)&stack0xffffffffffffffc8);
  return this;
}

Assistant:

UnicodeString &
UnicodeString::toTitle(BreakIterator *iter, const Locale &locale, uint32_t options) {
    LocalPointer<BreakIterator> ownedIter;
    UErrorCode errorCode = U_ZERO_ERROR;
    iter = ustrcase_getTitleBreakIterator(&locale, "", options, iter, ownedIter, errorCode);
    if (iter == nullptr) {
        setToBogus();
        return *this;
    }
    caseMap(ustrcase_getCaseLocale(locale.getBaseName()), options, iter, ustrcase_internalToTitle);
    return *this;
}